

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

char * __thiscall CDefineTable::Get(CDefineTable *this,char *name)

{
  byte bVar1;
  CDefineTableEntry *pCVar2;
  int iVar3;
  ulong uVar4;
  CDefineTableEntry **ppCVar5;
  
  this->DefArrayList = (CStringsList *)0x0;
  if ((name == (char *)0x0) || (bVar1 = *name, bVar1 == 0)) {
    return (char *)0x0;
  }
  if (name[1] == '_') {
    iVar3 = strcmp(name,"__COUNTER__");
    if (iVar3 == 0) {
      snprintf(defineGet__Counter__Buffer,0x1e,"%d",(ulong)(uint)PredefinedCounter);
      PredefinedCounter = PredefinedCounter + 1;
      return defineGet__Counter__Buffer;
    }
    iVar3 = strcmp(name,"__LINE__");
    if (iVar3 == 0) {
      if (sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_start ==
          sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)sourcePosStack.super__Vector_base<TextFilePos,_std::allocator<TextFilePos>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].line;
      }
      snprintf(defineGet__Line__Buffer,0x1e,"%d",uVar4);
      return defineGet__Line__Buffer;
    }
  }
  ppCVar5 = this->defs + (bVar1 & 0x7f);
  while( true ) {
    pCVar2 = *ppCVar5;
    if (pCVar2 == (CDefineTableEntry *)0x0) {
      return (char *)0x0;
    }
    iVar3 = strcmp(name,pCVar2->name);
    if (iVar3 == 0) break;
    ppCVar5 = &pCVar2->next;
  }
  this->DefArrayList = pCVar2->nss;
  return pCVar2->value;
}

Assistant:

const char* CDefineTable::Get(const char* name) {
	DefArrayList = nullptr;
	if (nullptr == name || 0 == name[0]) return nullptr;
	// the __COUNTER__ and __LINE__ have fully dynamic custom implementation here
	if ('_' == name[1]) {
		if (!strcmp(name, "__COUNTER__")) {
			SPRINTF1(defineGet__Counter__Buffer, 30, "%d", PredefinedCounter);
			++PredefinedCounter;
			return defineGet__Counter__Buffer;
		}
		if (!strcmp(name, "__LINE__")) {
			SPRINTF1(defineGet__Line__Buffer, 30, "%d", sourcePosStack.empty() ? 0 : sourcePosStack.back().line);
			return defineGet__Line__Buffer;
		}
	}
	CDefineTableEntry* p = defs[(*name)&127];
	while (p && strcmp(name, p->name)) p = p->next;
	if (nullptr == p) return nullptr;
	DefArrayList = p->nss;
	return p->value;
}